

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_Common.cpp
# Opt level: O0

void nullcPrintVariableInfo(ExternTypeInfo *type,char *ptr,uint indentDepth)

{
  int iVar1;
  char *pcVar2;
  char *codeSymbols;
  uint indentDepth_local;
  char *ptr_local;
  ExternTypeInfo *type_local;
  
  pcVar2 = nullcDebugSymbols((uint *)0x0);
  iVar1 = strcmp(pcVar2 + type->offsetToName,"typeid");
  if (iVar1 != 0) {
    iVar1 = strcmp(pcVar2 + type->offsetToName,"auto ref");
    if (iVar1 == 0) {
      nullcPrintAutoInfo(ptr,indentDepth);
    }
    else {
      iVar1 = strcmp(pcVar2 + type->offsetToName,"auto[]");
      if (iVar1 == 0) {
        nullcPrintAutoArrayInfo(ptr,indentDepth);
      }
      else {
        switch(type->subCat) {
        case CAT_NONE:
          break;
        case CAT_ARRAY:
          nullcPrintArrayVariableInfo(type,ptr,indentDepth);
          break;
        case CAT_POINTER:
          break;
        case CAT_FUNCTION:
          nullcPrintFunctionPointerInfo(type,ptr,indentDepth);
          break;
        case CAT_CLASS:
          nullcPrintComplexVariableInfo(type,ptr,indentDepth);
        }
      }
    }
  }
  return;
}

Assistant:

void nullcPrintVariableInfo(const ExternTypeInfo& type, char* ptr, unsigned indentDepth)
{
	char *codeSymbols = nullcDebugSymbols(NULL);

	if(strcmp(codeSymbols + type.offsetToName, "typeid") == 0)
		return;

	if(strcmp(codeSymbols + type.offsetToName, "auto ref") == 0)
	{
		nullcPrintAutoInfo(ptr, indentDepth);
		return;
	}
	if(strcmp(codeSymbols + type.offsetToName, "auto[]") == 0)
	{
		nullcPrintAutoArrayInfo(ptr, indentDepth);
		return;
	}

	switch(type.subCat)
	{
	case ExternTypeInfo::CAT_NONE:
		break;
	case ExternTypeInfo::CAT_ARRAY:
		nullcPrintArrayVariableInfo(type, ptr, indentDepth);
		break;
	case ExternTypeInfo::CAT_POINTER:
		break;
	case ExternTypeInfo::CAT_FUNCTION:
		nullcPrintFunctionPointerInfo(type, ptr, indentDepth);
		break;
	case ExternTypeInfo::CAT_CLASS:
		nullcPrintComplexVariableInfo(type, ptr, indentDepth);
		break;
	}
}